

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

optional<tinyusdz::value::half> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::half>
          (optional<tinyusdz::value::half> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  half value;
  storage_t<tinyusdz::value::half> local_2e;
  optional<tinyusdz::value::half> local_2c;
  double local_28;
  
  this_00 = &this->_var;
  local_28 = t;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::half>
                      (this_00,local_28,interp,(half *)&local_2e);
    if (!bVar1) {
      local_2e = (storage_t<tinyusdz::value::half>)0x0;
    }
    __return_storage_ptr__->has_value_ = bVar1;
    __return_storage_ptr__->contained = local_2e;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::half>(&local_2c,this_00);
    __return_storage_ptr__->has_value_ = local_2c.has_value_;
    if (local_2c.has_value_ == true) {
      __return_storage_ptr__->contained = local_2c.contained;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }